

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall
wallet::LegacyDataSPKM::GetPubKey(LegacyDataSPKM *this,CKeyID *address,CPubKey *vchPubKeyOut)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  const_iterator cVar5;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock36;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock36,&(this->super_FillableSigningProvider).cs_KeyStore,"cs_KeyStore",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0x429,false);
  iVar4 = (*((this->super_ScriptPubKeyMan).m_storage)->_vptr_WalletStorage[9])();
  if ((char)iVar4 == '\0') {
    bVar2 = FillableSigningProvider::GetPubKey
                      (&this->super_FillableSigningProvider,address,vchPubKeyOut);
    bVar3 = true;
    if (!bVar2) {
      bVar3 = GetWatchPubKey(this,address,vchPubKeyOut);
    }
  }
  else {
    cVar5 = std::
            _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
            ::find(&(this->mapCryptedKeys)._M_t,address);
    if ((_Rb_tree_header *)cVar5._M_node ==
        &(this->mapCryptedKeys)._M_t._M_impl.super__Rb_tree_header) {
      bVar3 = GetWatchPubKey(this,address,vchPubKeyOut);
    }
    else {
      memcpy(vchPubKeyOut,&cVar5._M_node[1]._M_right,0x41);
      bVar3 = true;
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock36.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool LegacyDataSPKM::GetPubKey(const CKeyID &address, CPubKey& vchPubKeyOut) const
{
    LOCK(cs_KeyStore);
    if (!m_storage.HasEncryptionKeys()) {
        if (!FillableSigningProvider::GetPubKey(address, vchPubKeyOut)) {
            return GetWatchPubKey(address, vchPubKeyOut);
        }
        return true;
    }

    CryptedKeyMap::const_iterator mi = mapCryptedKeys.find(address);
    if (mi != mapCryptedKeys.end())
    {
        vchPubKeyOut = (*mi).second.first;
        return true;
    }
    // Check for watch-only pubkeys
    return GetWatchPubKey(address, vchPubKeyOut);
}